

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinsizes.cpp
# Opt level: O0

void testwin1(void)

{
  char *local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  Am_Style *local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined4 local_68;
  undefined4 local_60;
  undefined4 local_58;
  undefined8 local_50;
  Am_Style *local_40;
  Am_Drawonable *local_38;
  undefined1 *local_30;
  Am_Drawonable *local_28;
  Am_Style local_10 [8];
  
  local_38 = root;
  local_40 = local_10;
  Am_Style::Am_Style(local_40,(Am_Style *)&red);
  local_a0 = local_40;
  local_b8 = "D1 Icon";
  local_50 = 0;
  local_58 = 1;
  local_60 = 0;
  local_68 = 1;
  local_70 = 1;
  local_78 = 0;
  local_80 = 0;
  local_88 = 1;
  local_90 = 1;
  local_98 = 0;
  local_a8 = 0;
  local_b0 = 1;
  local_30 = (undefined1 *)&local_b8;
  d1 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_38)(local_38,0x352,100,200,200,"D1");
  local_28 = d1;
  Am_Style::~Am_Style(local_10);
  print_win_info(d1,"D1");
  return;
}

Assistant:

void
testwin1()
{

  d1 = root->Create(TESTWINSIZES_D1_LEFT, 100, 200, 200, "D1", "D1 Icon", true,
                    false, red, false,
                    // Min/max width and height
                    1, 1, 0, 0, true,
                    // Query user for position
                    true, false);
  print_win_info(d1, "D1");
}